

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

void __thiscall MIDISong2::AdvanceTracks(MIDISong2 *this,DWORD time)

{
  int iVar1;
  DWORD *pDVar2;
  long lVar3;
  
  iVar1 = this->NumTracks;
  pDVar2 = &this->Tracks->Delay;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    if (*(bool *)(pDVar2 + 2) == false) {
      *pDVar2 = *pDVar2 - time;
      pDVar2[1] = pDVar2[1] + time;
    }
    pDVar2 = pDVar2 + 0x10;
  }
  return;
}

Assistant:

void MIDISong2::AdvanceTracks(DWORD time)
{
	for (int i = 0; i < NumTracks; ++i)
	{
		if (!Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
}